

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

void sam_hdr_free(SAM_hdr *hdr)

{
  int iVar1;
  char *__ptr;
  kh_sam_hdr_t *__ptr_00;
  kh_m_s2i_t *pkVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  
  if ((hdr != (SAM_hdr *)0x0) && (iVar1 = hdr->ref_count, hdr->ref_count = iVar1 + -1, iVar1 < 2)) {
    __ptr = (hdr->text).s;
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
    __ptr_00 = hdr->h;
    if (__ptr_00 != (kh_sam_hdr_t *)0x0) {
      free(__ptr_00->keys);
      free(__ptr_00->flags);
      free(__ptr_00->vals);
      free(__ptr_00);
    }
    pkVar2 = hdr->ref_hash;
    if (pkVar2 != (kh_m_s2i_t *)0x0) {
      free(pkVar2->keys);
      free(pkVar2->flags);
      free(pkVar2->vals);
      free(pkVar2);
    }
    if (hdr->ref != (SAM_SQ *)0x0) {
      if (0 < hdr->nref) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pvVar3 = *(void **)((long)&hdr->ref->name + lVar4);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar5 < hdr->nref);
      }
      free(hdr->ref);
    }
    pkVar2 = hdr->rg_hash;
    if (pkVar2 != (kh_m_s2i_t *)0x0) {
      free(pkVar2->keys);
      free(pkVar2->flags);
      free(pkVar2->vals);
      free(pkVar2);
    }
    if (hdr->rg != (SAM_RG *)0x0) {
      if (0 < hdr->nrg) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pvVar3 = *(void **)((long)&hdr->rg->name + lVar4);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x20;
        } while (lVar5 < hdr->nrg);
      }
      free(hdr->rg);
    }
    pkVar2 = hdr->pg_hash;
    if (pkVar2 != (kh_m_s2i_t *)0x0) {
      free(pkVar2->keys);
      free(pkVar2->flags);
      free(pkVar2->vals);
      free(pkVar2);
    }
    if (hdr->pg != (SAM_PG *)0x0) {
      if (0 < hdr->npg) {
        lVar4 = 0;
        lVar5 = 0;
        do {
          pvVar3 = *(void **)((long)&hdr->pg->name + lVar4);
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x28;
        } while (lVar5 < hdr->npg);
      }
      free(hdr->pg);
    }
    if (hdr->pg_end != (int *)0x0) {
      free(hdr->pg_end);
    }
    if (hdr->type_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->type_pool);
    }
    if (hdr->tag_pool != (pool_alloc_t *)0x0) {
      pool_destroy(hdr->tag_pool);
    }
    if (hdr->str_pool != (string_alloc_t *)0x0) {
      string_pool_destroy(hdr->str_pool);
    }
    free(hdr);
    return;
  }
  return;
}

Assistant:

void sam_hdr_free(SAM_hdr *hdr) {
    if (!hdr)
	return;

    if (--hdr->ref_count > 0)
	return;

    if (ks_str(&hdr->text))
	KS_FREE(&hdr->text);

    if (hdr->h)
	kh_destroy(sam_hdr, hdr->h);

    if (hdr->ref_hash)
	kh_destroy(m_s2i, hdr->ref_hash);

    if (hdr->ref) {
	int i;
	for (i = 0; i < hdr->nref; i++)
	    if (hdr->ref[i].name)
		free(hdr->ref[i].name);
	free(hdr->ref);
    }

    if (hdr->rg_hash)
	kh_destroy(m_s2i, hdr->rg_hash);

    if (hdr->rg) {
	int i;
	for (i = 0; i < hdr->nrg; i++)
	    if (hdr->rg[i].name)
		free(hdr->rg[i].name);
	free(hdr->rg);
    }

    if (hdr->pg_hash)
	kh_destroy(m_s2i, hdr->pg_hash);

    if (hdr->pg) {
	int i;
	for (i = 0; i < hdr->npg; i++)
	    if (hdr->pg[i].name)
		free(hdr->pg[i].name);
	free(hdr->pg);
    }

    if (hdr->pg_end)
	free(hdr->pg_end);

    if (hdr->type_pool)
	pool_destroy(hdr->type_pool);

    if (hdr->tag_pool)
	pool_destroy(hdr->tag_pool);

    if (hdr->str_pool)
	string_pool_destroy(hdr->str_pool);

    free(hdr);
}